

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_QuakeEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  VMValue *pVVar3;
  VMValue *pVVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  bool bVar7;
  AActor *activator;
  char *pcVar8;
  int flags;
  int falloff;
  int highpoint;
  void *waveSpeedX;
  void *waveSpeedY;
  void *waveSpeedZ;
  double rollIntensity;
  undefined1 local_34 [4];
  
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003ea591;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ea581:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ea591:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143d,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003ea2ca;
    bVar7 = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
    if (!bVar7) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ea591;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003ea581;
LAB_003ea2ca:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_003ea5b9:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143e,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ea5b9;
  }
  if ((uint)numparam < 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_003ea5e1:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143f,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ea5e1;
  }
  if (numparam == 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_003ea609:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1440,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ea609;
  }
  if ((uint)numparam < 5) {
    pcVar8 = "(paramnum) < numparam";
LAB_003ea631:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1441,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ea631;
  }
  if (numparam == 5) {
    pcVar8 = "(paramnum) < numparam";
LAB_003ea659:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1442,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ea659;
  }
  if ((uint)numparam < 7) {
    pcVar8 = "(paramnum) < numparam";
LAB_003ea681:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1443,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ea681;
  }
  pVVar1 = param + 1;
  pVVar2 = param + 2;
  pVVar3 = param + 3;
  pVVar4 = param + 4;
  pVVar5 = param + 5;
  pVVar6 = param + 6;
  if (numparam == 7) {
    param = defaultparam->Array;
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ea78b:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1444,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
LAB_003ea3af:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ea7aa:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1445,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    flags = param[8].field_0.i;
LAB_003ea3c4:
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ea75a:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1446,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    waveSpeedX = param[9].field_0.field_1.a;
LAB_003ea3db:
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ea73b:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1447,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    waveSpeedY = param[10].field_0.field_1.a;
LAB_003ea3f2:
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ea71c:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1448,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    waveSpeedZ = param[0xb].field_0.field_1.a;
LAB_003ea409:
    if (param[0xc].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ea6fd:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1449,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    falloff = param[0xc].field_0.i;
LAB_003ea41e:
    if (param[0xd].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ea6de:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144a,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    highpoint = param[0xd].field_0.i;
LAB_003ea433:
    if (param[0xe].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ea6bf:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144b,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    rollIntensity = param[0xe].field_0.f;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ea78b;
    }
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003ea3af;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ea7aa;
    }
    flags = param[8].field_0.i;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003ea3c4;
    }
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ea75a;
    }
    waveSpeedX = (void *)param[9].field_0.f;
    if ((uint)numparam < 0xb) {
      param = defaultparam->Array;
      goto LAB_003ea3db;
    }
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ea73b;
    }
    waveSpeedY = (void *)param[10].field_0.f;
    if (numparam == 0xb) {
      param = defaultparam->Array;
      goto LAB_003ea3f2;
    }
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ea71c;
    }
    waveSpeedZ = (void *)param[0xb].field_0.f;
    if ((uint)numparam < 0xd) {
      param = defaultparam->Array;
      goto LAB_003ea409;
    }
    if (param[0xc].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ea6fd;
    }
    falloff = param[0xc].field_0.i;
    if (numparam == 0xd) {
      param = defaultparam->Array;
      goto LAB_003ea41e;
    }
    if (param[0xd].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ea6de;
    }
    highpoint = param[0xd].field_0.i;
    if ((uint)numparam < 0xf) {
      param = defaultparam->Array;
      goto LAB_003ea433;
    }
    if (param[0xe].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ea6bf;
    }
    rollIntensity = param[0xe].field_0.f;
    if (numparam != 0xf) {
      if (param[0xf].field_0.field_3.Type != '\x01') {
        pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_003ea6a0;
      }
      goto LAB_003ea458;
    }
    param = defaultparam->Array;
  }
  if (param[0xf].field_0.field_3.Type != '\x01') {
    pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ea6a0:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x144c,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003ea458:
  P_StartQuakeXYZ(activator,0,(pVVar1->field_0).i,(pVVar2->field_0).i,(pVVar3->field_0).i,
                  (pVVar4->field_0).i,(pVVar5->field_0).i,(pVVar6->field_0).i,
                  (FSoundID)(int)local_34,flags,(double)waveSpeedX,(double)waveSpeedY,
                  (double)waveSpeedZ,falloff,highpoint,rollIntensity,param[0xf].field_0.f);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_QuakeEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(intensityX);
	PARAM_INT(intensityY);
	PARAM_INT(intensityZ);
	PARAM_INT(duration);
	PARAM_INT(damrad);
	PARAM_INT(tremrad);
	PARAM_SOUND_DEF(sound);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(mulWaveX);
	PARAM_FLOAT_DEF(mulWaveY);
	PARAM_FLOAT_DEF(mulWaveZ);
	PARAM_INT_DEF(falloff);
	PARAM_INT_DEF(highpoint);
	PARAM_FLOAT_DEF(rollIntensity);
	PARAM_FLOAT_DEF(rollWave);
	P_StartQuakeXYZ(self, 0, intensityX, intensityY, intensityZ, duration, damrad, tremrad, sound, flags, mulWaveX, mulWaveY, mulWaveZ, falloff, highpoint, 
		rollIntensity, rollWave);
	return 0;
}